

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_30::NetworkAddressImpl::clone
          (NetworkAddressImpl *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  LowLevelAsyncIoProvider *params;
  NetworkFilter *params_1;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> content;
  Array<kj::(anonymous_namespace)::SocketAddress> local_40;
  Own<kj::(anonymous_namespace)::NetworkAddressImpl> local_28;
  __fn *local_18;
  NetworkAddressImpl *this_local;
  
  params = *(LowLevelAsyncIoProvider **)(__fn + 8);
  params_1 = *(NetworkFilter **)(__fn + 0x10);
  local_18 = __fn;
  this_local = this;
  content = Array<kj::(anonymous_namespace)::SocketAddress>::asPtr
                      ((Array<kj::(anonymous_namespace)::SocketAddress> *)(__fn + 0x18));
  heapArray<kj::(anonymous_namespace)::SocketAddress>(&local_40,content);
  heap<kj::(anonymous_namespace)::NetworkAddressImpl,kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::Array<kj::(anonymous_namespace)::SocketAddress>>
            ((kj *)&local_28,params,params_1,&local_40);
  Own<kj::NetworkAddress>::Own<kj::(anonymous_namespace)::NetworkAddressImpl,void>
            ((Own<kj::NetworkAddress> *)this,&local_28);
  Own<kj::(anonymous_namespace)::NetworkAddressImpl>::~Own(&local_28);
  Array<kj::(anonymous_namespace)::SocketAddress>::~Array(&local_40);
  return (int)this;
}

Assistant:

Own<NetworkAddress> clone() override {
    return kj::heap<NetworkAddressImpl>(lowLevel, filter, kj::heapArray(addrs.asPtr()));
  }